

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O3

void __thiscall
QAccessibleLineEdit::replaceText
          (QAccessibleLineEdit *this,int startOffset,int endOffset,QString *text)

{
  QLineEdit *this_00;
  QLineEdit *this_01;
  QString *text_00;
  long in_FS_OFFSET;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  this_00 = (QLineEdit *)QMetaObject::cast((QObject *)&QLineEdit::staticMetaObject);
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  this_01 = (QLineEdit *)QMetaObject::cast((QObject *)&QLineEdit::staticMetaObject);
  QLineEdit::text(&local_50,this_01);
  text_00 = (QString *)
            QString::replace((longlong)&local_50,(long)startOffset,
                             (QString *)(long)(endOffset - startOffset));
  QLineEdit::setText(this_00,text_00);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAccessibleLineEdit::replaceText(int startOffset, int endOffset, const QString &text)
{
    lineEdit()->setText(lineEdit()->text().replace(startOffset, endOffset - startOffset, text));
}